

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall
QDockAreaLayoutInfo::tab(QDockAreaLayoutInfo *this,int index,QLayoutItem *dockWidgetItem)

{
  QList<QDockAreaLayoutItem> *this_00;
  QMainWindow *pQVar1;
  Orientation OVar2;
  int iVar3;
  QDockAreaLayoutInfo *this_01;
  pointer pQVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QDockAreaLayoutItem local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed == true) {
    local_60.subinfo = (QDockAreaLayoutInfo *)0x0;
    local_60.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_60.pos = 0;
    local_60.size = -1;
    local_60.flags = 0;
    local_60.widgetItem = dockWidgetItem;
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
              ((QGenericArrayOps<QDockAreaLayoutItem> *)&this->item_list,(this->item_list).d.size,
               &local_60);
    QList<QDockAreaLayoutItem>::end(&this->item_list);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_60);
    this_01 = this;
  }
  else {
    this_01 = (QDockAreaLayoutInfo *)operator_new(0x70);
    iVar3 = this->tabBarShape;
    pQVar1 = this->mainWindow;
    this_01->sep = this->sep;
    (this_01->separatorWidgets).d.size = 0;
    (this_01->separatorWidgets).d.d = (Data *)0x0;
    (this_01->separatorWidgets).d.ptr = (QWidget **)0x0;
    OVar2 = this->o;
    this_01->dockPos = this->dockPos;
    this_01->o = OVar2;
    (this_01->rect).x1 = 0;
    (this_01->rect).y1 = 0;
    (this_01->rect).x2 = -1;
    (this_01->rect).y2 = -1;
    this_01->mainWindow = pQVar1;
    this_00 = &this_01->item_list;
    this_01->tabBar = (QTabBar *)0x0;
    *(undefined8 *)((long)&(this_01->item_list).d.ptr + 1) = 0;
    *(undefined8 *)((long)&(this_01->item_list).d.size + 1) = 0;
    (this_01->item_list).d.d = (Data *)0x0;
    (this_01->item_list).d.ptr = (QDockAreaLayoutItem *)0x0;
    this_01->tabBarShape = iVar3;
    pQVar4 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    pQVar4[index].subinfo = this_01;
    local_60.widgetItem = (this->item_list).d.ptr[index].widgetItem;
    local_60.subinfo = (QDockAreaLayoutInfo *)0x0;
    local_60.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_60.pos = 0;
    local_60.size = -1;
    local_60.flags = 0;
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
              ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,0,&local_60);
    QList<QDockAreaLayoutItem>::end(this_00);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_60);
    pQVar4 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    pQVar4[index].widgetItem = (QLayoutItem *)0x0;
    local_60.subinfo = (QDockAreaLayoutInfo *)0x0;
    local_60.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_60.pos = 0;
    local_60.size = -1;
    local_60.flags = 0;
    local_60.widgetItem = dockWidgetItem;
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
              ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,(this_01->item_list).d.size,
               &local_60);
    QList<QDockAreaLayoutItem>::end(this_00);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_60);
    this_01->tabbed = true;
  }
  updateTabBar(this_01);
  iVar3 = (*dockWidgetItem->_vptr_QLayoutItem[0xd])(dockWidgetItem);
  setCurrentTabId(this_01,CONCAT44(extraout_var,iVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::tab(int index, QLayoutItem *dockWidgetItem)
{
    if (tabbed) {
        item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        updateTabBar();
        setCurrentTab(dockWidgetItem->widget());
    } else {
        QDockAreaLayoutInfo *new_info
            = new QDockAreaLayoutInfo(sep, dockPos, o, tabBarShape, mainWindow);
        item_list[index].subinfo = new_info;
        new_info->item_list.append(QDockAreaLayoutItem(item_list.at(index).widgetItem));
        item_list[index].widgetItem = nullptr;
        new_info->item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        new_info->tabbed = true;
        new_info->updateTabBar();
        new_info->setCurrentTab(dockWidgetItem->widget());
    }
}